

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Close(CopyingFileInputStream *this)

{
  int iVar1;
  LogMessage *pLVar2;
  int *piVar3;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  CopyingFileInputStream *local_18;
  CopyingFileInputStream *this_local;
  
  local_18 = this;
  if ((this->is_closed_ & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"!is_closed_");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x65,local_40._M_len,local_40._M_str);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  this->is_closed_ = true;
  iVar1 = anon_unknown_4::close_no_eintr(this->file_);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    this->errno_ = *piVar3;
  }
  return iVar1 == 0;
}

Assistant:

bool FileInputStream::CopyingFileInputStream::Close() {
  ABSL_CHECK(!is_closed_);

  is_closed_ = true;
  if (close_no_eintr(file_) != 0) {
    // The docs on close() do not specify whether a file descriptor is still
    // open after close() fails with EIO.  However, the glibc source code
    // seems to indicate that it is not.
    errno_ = errno;
    return false;
  }

  return true;
}